

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp.h
# Opt level: O2

RegEx * YAML::Exp::ValueInFlow(void)

{
  int iVar1;
  RegEx *ex1;
  allocator local_89;
  string local_88;
  RegEx local_68;
  RegEx local_48;
  RegEx local_28;
  
  if (ValueInFlow()::e == '\0') {
    iVar1 = __cxa_guard_acquire(&ValueInFlow()::e);
    if (iVar1 != 0) {
      RegEx::RegEx(&local_28,':');
      ex1 = BlankOrBreak();
      std::__cxx11::string::string((string *)&local_88,",]}",&local_89);
      RegEx::RegEx(&local_68,&local_88,REGEX_OR);
      operator|(&local_48,ex1,&local_68);
      operator+(&ValueInFlow::e,&local_28,&local_48);
      std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_48.m_params);
      std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_68.m_params);
      std::__cxx11::string::~string((string *)&local_88);
      std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_28.m_params);
      __cxa_atexit(RegEx::~RegEx,&ValueInFlow::e,&__dso_handle);
      __cxa_guard_release(&ValueInFlow()::e);
    }
  }
  return &ValueInFlow::e;
}

Assistant:

inline const RegEx& ValueInFlow() {
  static const RegEx e = RegEx(':') + (BlankOrBreak() | RegEx(",]}", REGEX_OR));
  return e;
}